

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_structs.c
# Opt level: O0

exr_result_t
internal_exr_alloc_context
          (exr_context_t *out,exr_context_initializer_t *initializers,
          _INTERNAL_EXR_CONTEXT_MODE mode,size_t default_size)

{
  code *pcVar1;
  char *pcVar2;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  undefined8 *in_RDI;
  exr_priv_part_t part;
  size_t extra_data;
  int gmaxh;
  int gmaxw;
  exr_context_t ret;
  exr_result_t rv;
  void *memptr;
  int *in_stack_000000b8;
  exr_priv_part_t *in_stack_000000c0;
  exr_context_t in_stack_000000c8;
  long local_50;
  int local_48;
  int local_44;
  undefined1 *local_40;
  exr_result_t local_34;
  undefined1 *local_30;
  int local_1c;
  long local_18;
  undefined8 *local_10;
  
  *in_RDI = 0;
  if ((*(long *)(in_RSI + 0x28) != 0) || (local_50 = in_RCX, *(long *)(in_RSI + 0x38) != 0)) {
    local_50 = 0;
  }
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_30 = (undefined1 *)(**(code **)(in_RSI + 0x10))(local_50 + 0x228);
  if (local_30 == (undefined1 *)0x0) {
    pcVar1 = *(code **)(local_18 + 8);
    pcVar2 = exr_get_default_error_message(1);
    (*pcVar1)(0,1,pcVar2);
    local_34 = 1;
  }
  else {
    memset(local_30,0,0x228);
    local_40 = local_30;
    *local_30 = (char)local_1c;
    *(undefined8 *)(local_30 + 0x80) = *(undefined8 *)(local_18 + 0x20);
    if ((*(long *)(local_18 + 0x28) == 0) && (*(long *)(local_18 + 0x38) == 0)) {
      if (local_50 != 0) {
        *(undefined1 **)(local_30 + 0x88) = local_30 + 0x228;
      }
    }
    else {
      *(undefined8 *)(local_30 + 0x88) = *(undefined8 *)(local_18 + 0x20);
    }
    *(code **)(local_30 + 0x38) = dispatch_standard_error;
    *(code **)(local_30 + 0x40) = dispatch_error;
    *(code **)(local_30 + 0x48) = dispatch_print_error;
    *(undefined8 *)(local_30 + 0x50) = *(undefined8 *)(local_18 + 8);
    *(undefined8 *)(local_30 + 0x58) = *(undefined8 *)(local_18 + 0x10);
    *(undefined8 *)(local_30 + 0x60) = *(undefined8 *)(local_18 + 0x18);
    exr_get_default_maximum_image_size(&local_44,&local_48);
    if (*(int *)(local_18 + 0x48) < 1) {
      *(int *)(local_40 + 0x68) = local_44;
    }
    else {
      *(undefined4 *)(local_40 + 0x68) = *(undefined4 *)(local_18 + 0x48);
    }
    if ((((0 < *(int *)(local_40 + 0x68)) && (0 < local_44)) && (*(int *)(local_40 + 0x68) != 0)) &&
       (local_44 < *(int *)(local_40 + 0x68))) {
      *(int *)(local_40 + 0x68) = local_44;
    }
    if (*(int *)(local_18 + 0x4c) < 1) {
      *(int *)(local_40 + 0x6c) = local_48;
    }
    else {
      *(undefined4 *)(local_40 + 0x6c) = *(undefined4 *)(local_18 + 0x4c);
    }
    if (((0 < *(int *)(local_40 + 0x6c)) && (0 < local_48)) &&
       ((*(int *)(local_40 + 0x6c) != 0 && (local_48 < *(int *)(local_40 + 0x6c))))) {
      *(int *)(local_40 + 0x6c) = local_48;
    }
    exr_get_default_maximum_tile_size(&local_44,&local_48);
    if (*(int *)(local_18 + 0x50) < 1) {
      *(int *)(local_40 + 0x70) = local_44;
    }
    else {
      *(undefined4 *)(local_40 + 0x70) = *(undefined4 *)(local_18 + 0x50);
    }
    if (((0 < *(int *)(local_40 + 0x70)) && (0 < local_44)) &&
       ((*(int *)(local_40 + 0x70) != 0 && (local_44 < *(int *)(local_40 + 0x70))))) {
      *(int *)(local_40 + 0x70) = local_44;
    }
    if (*(int *)(local_18 + 0x54) < 1) {
      *(int *)(local_40 + 0x74) = local_48;
    }
    else {
      *(undefined4 *)(local_40 + 0x74) = *(undefined4 *)(local_18 + 0x54);
    }
    if ((((0 < *(int *)(local_40 + 0x74)) && (0 < local_48)) && (*(int *)(local_40 + 0x74) != 0)) &&
       (local_48 < *(int *)(local_40 + 0x74))) {
      *(int *)(local_40 + 0x74) = local_48;
    }
    exr_get_default_zip_compression_level((int *)(local_40 + 0x78));
    exr_get_default_dwa_compression_quality((float *)(local_40 + 0x7c));
    if (-1 < *(int *)(local_18 + 0x58)) {
      *(undefined4 *)(local_40 + 0x78) = *(undefined4 *)(local_18 + 0x58);
    }
    if (0.0 <= *(float *)(local_18 + 0x5c)) {
      *(undefined4 *)(local_40 + 0x7c) = *(undefined4 *)(local_18 + 0x5c);
    }
    if ((*(uint *)(local_18 + 0x60) & 1) != 0) {
      local_40[6] = 1;
    }
    if ((*(uint *)(local_18 + 0x60) & 2) != 0) {
      local_40[7] = 1;
    }
    local_40[0x220] = (byte)*(undefined4 *)(local_18 + 0x60) & 4;
    local_40[0x221] = (byte)*(undefined4 *)(local_18 + 0x60) & 8;
    *(undefined8 *)(local_40 + 0x98) = 0xffffffffffffffff;
    local_40[2] = 0x1f;
    *(undefined8 *)(local_40 + 0x90) = *(undefined8 *)(local_18 + 0x40);
    *(undefined8 *)(local_40 + 0xa0) = *(undefined8 *)(local_18 + 0x28);
    *(undefined8 *)(local_40 + 0xa8) = *(undefined8 *)(local_18 + 0x38);
    local_34 = pthread_mutex_init((pthread_mutex_t *)(local_40 + 0x1f8),(pthread_mutexattr_t *)0x0);
    if (local_34 != 0) {
      (**(code **)(local_18 + 0x18))(local_30);
      *local_10 = 0;
      return 1;
    }
    *local_10 = local_40;
    local_34 = 0;
    if ((local_1c != 1) &&
       (local_34 = internal_exr_add_part(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8),
       local_34 != 0)) {
      (**(code **)(local_18 + 0x18))(local_30);
      *local_10 = 0;
    }
  }
  return local_34;
}

Assistant:

exr_result_t
internal_exr_alloc_context (
    exr_context_t*                   out,
    const exr_context_initializer_t* initializers,
    enum _INTERNAL_EXR_CONTEXT_MODE  mode,
    size_t                           default_size)
{
    void*         memptr;
    exr_result_t  rv;
    exr_context_t ret;
    int           gmaxw, gmaxh;
    size_t        extra_data;

    *out = NULL;
    if (initializers->read_fn || initializers->write_fn)
        extra_data = 0;
    else
        extra_data = default_size;

    memptr = (initializers->alloc_fn) (
        sizeof (struct _priv_exr_context_t) + extra_data);
    if (memptr)
    {
        memset (memptr, 0, sizeof (struct _priv_exr_context_t));

        ret       = memptr;
        ret->mode = (uint8_t) mode;
        /* stash this separately so when a user queries they don't see
         * any of our internal hijinx */
        ret->real_user_data = initializers->user_data;
        if (initializers->read_fn || initializers->write_fn)
            ret->user_data = initializers->user_data;
        else if (extra_data > 0)
            ret->user_data =
                (((uint8_t*) memptr) + sizeof (struct _priv_exr_context_t));

        ret->standard_error   = &dispatch_standard_error;
        ret->report_error     = &dispatch_error;
        ret->print_error      = &dispatch_print_error;
        ret->error_handler_fn = initializers->error_handler_fn;
        ret->alloc_fn         = initializers->alloc_fn;
        ret->free_fn          = initializers->free_fn;

        exr_get_default_maximum_image_size (&gmaxw, &gmaxh);
        if (initializers->max_image_width <= 0)
            ret->max_image_w = gmaxw;
        else
            ret->max_image_w = initializers->max_image_width;
        if (ret->max_image_w > 0 && gmaxw > 0 && ret->max_image_w &&
            ret->max_image_w > gmaxw)
            ret->max_image_w = gmaxw;

        if (initializers->max_image_height <= 0)
            ret->max_image_h = gmaxh;
        else
            ret->max_image_h = initializers->max_image_height;
        if (ret->max_image_h > 0 && gmaxh > 0 && ret->max_image_h &&
            ret->max_image_h > gmaxh)
            ret->max_image_h = gmaxh;

        exr_get_default_maximum_tile_size (&gmaxw, &gmaxh);
        if (initializers->max_tile_width <= 0)
            ret->max_tile_w = gmaxw;
        else
            ret->max_tile_w = initializers->max_tile_width;
        if (ret->max_tile_w > 0 && gmaxw > 0 && ret->max_tile_w &&
            ret->max_tile_w > gmaxw)
            ret->max_tile_w = gmaxw;

        if (initializers->max_tile_height <= 0)
            ret->max_tile_h = gmaxh;
        else
            ret->max_tile_h = initializers->max_tile_height;
        if (ret->max_tile_h > 0 && gmaxh > 0 && ret->max_tile_h &&
            ret->max_tile_h > gmaxh)
            ret->max_tile_h = gmaxh;

        exr_get_default_zip_compression_level (&ret->default_zip_level);
        exr_get_default_dwa_compression_quality (&ret->default_dwa_quality);
        if (initializers->zip_level >= 0)
            ret->default_zip_level = initializers->zip_level;
        if (initializers->dwa_quality >= 0.f)
            ret->default_dwa_quality = initializers->dwa_quality;

        if (initializers->flags & EXR_CONTEXT_FLAG_STRICT_HEADER)
            ret->strict_header = 1;
        if (initializers->flags & EXR_CONTEXT_FLAG_SILENT_HEADER_PARSE)
            ret->silent_header = 1;
        ret->disable_chunk_reconstruct =
            (initializers->flags &
             EXR_CONTEXT_FLAG_DISABLE_CHUNK_RECONSTRUCTION);
        ret->legacy_header =
            (initializers->flags & EXR_CONTEXT_FLAG_WRITE_LEGACY_HEADER);

        ret->file_size       = -1;
        ret->max_name_length = EXR_SHORTNAME_MAXLEN;

        ret->destroy_fn = initializers->destroy_fn;
        ret->read_fn    = initializers->read_fn;
        ret->write_fn   = initializers->write_fn;

#ifdef ILMTHREAD_THREADING_ENABLED
#    ifdef _WIN32
        InitializeCriticalSection (&(ret->mutex));
#    else
        rv = pthread_mutex_init (&(ret->mutex), NULL);
        if (rv != 0)
        {
            /* fairly unlikely... */
            (initializers->free_fn) (memptr);
            *out = NULL;
            return EXR_ERR_OUT_OF_MEMORY;
        }
#    endif
#endif

        *out = ret;
        rv   = EXR_ERR_SUCCESS;

        /* if we are reading the file, go ahead and set up the first
         * part to make parsing logic easier */
        if (mode != EXR_CONTEXT_WRITE)
        {
            exr_priv_part_t part;
            rv = internal_exr_add_part (ret, &part, NULL);
            if (rv != EXR_ERR_SUCCESS)
            {
                /* this should never happen since we reserve space for
                 * one in the struct, but maybe we changed
                 * something */
                (initializers->free_fn) (memptr);
                *out = NULL;
            }
        }
    }
    else
    {
        (initializers->error_handler_fn) (
            NULL,
            EXR_ERR_OUT_OF_MEMORY,
            exr_get_default_error_message (EXR_ERR_OUT_OF_MEMORY));
        rv = EXR_ERR_OUT_OF_MEMORY;
    }

    return rv;
}